

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O0

void * ResponseHandleRun(void *args)

{
  undefined4 uVar1;
  bool bVar2;
  ssize_t sVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  void *__buf;
  _Self local_2058;
  _Self local_2050;
  iterator it;
  char write_buf [4096];
  undefined1 local_1038 [4];
  int len;
  sockaddr_in addr_client;
  socklen_t len_client;
  int fd_client;
  HttpTestListener *handler;
  char buf [4096];
  HttpTestListener *client;
  void *args_local;
  
  buf._4088_8_ = args;
  memset(&handler,0,0x1000);
  addr_client.sin_zero[4] = '\0';
  addr_client.sin_zero[5] = '\0';
  addr_client.sin_zero[6] = '\0';
  addr_client.sin_zero[7] = '\0';
  addr_client.sin_zero[0] = '\x10';
  addr_client.sin_zero[1] = '\0';
  addr_client.sin_zero[2] = '\0';
  addr_client.sin_zero[3] = '\0';
  memset(local_1038,0,0x10);
  addr_client.sin_zero._4_4_ =
       accept(*(int *)((long)args + 0x10),(sockaddr *)local_1038,(socklen_t *)addr_client.sin_zero);
  http_parser_init_(*(undefined8 *)((long)args + 0x178),0);
  *(undefined8 *)(*(long *)((long)args + 0x178) + 0x18) = buf._4088_8_;
  do {
    sVar3 = recv(addr_client.sin_zero._4_4_,&handler,0x1000,0);
    if (((int)sVar3 < 1) ||
       (http_parser_execute_(*(undefined8 *)(buf._4088_8_ + 0x178),&htp_hooks,&handler),
       (*(byte *)(*(long *)((long)args + 0x178) + 0x17) & 0x7f) != 0)) break;
  } while ((*args & 1) == 0);
  if ((*args & 1) != 0) {
    pcVar4 = get_status_string(*(int *)((long)args + 0x18),0);
    snprintf((char *)&it,0x1000,"HTTP/1.1 %s\r\n",pcVar4);
    uVar1 = addr_client.sin_zero._4_4_;
    sVar5 = strlen((char *)&it);
    write(uVar1,&it,sVar5);
    local_2050._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)args + 0x100));
    while( true ) {
      local_2058._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)args + 0x100));
      bVar2 = std::operator!=(&local_2050,&local_2058);
      if (!bVar2) break;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_2050);
      uVar6 = std::__cxx11::string::c_str();
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_2050);
      uVar7 = std::__cxx11::string::c_str();
      snprintf((char *)&it,0x1000,"%s: %s\r\n",uVar6,uVar7);
      uVar1 = addr_client.sin_zero._4_4_;
      sVar5 = strlen((char *)&it);
      write(uVar1,&it,sVar5);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_2050,0);
    }
    write(addr_client.sin_zero._4_4_,"\r\n",2);
    lVar8 = std::__cxx11::string::size();
    uVar1 = addr_client.sin_zero._4_4_;
    if (lVar8 != 0) {
      __buf = (void *)std::__cxx11::string::c_str();
      sVar5 = std::__cxx11::string::size();
      write(uVar1,__buf,sVar5);
    }
  }
  close(*(int *)((long)args + 0x10));
  close(addr_client.sin_zero._4_4_);
  return (void *)0x0;
}

Assistant:

void * ResponseHandleRun(void* args) {
  HttpTestListener* client = (HttpTestListener*)args;
  char buf[4096] = {};
  HttpTestListener* handler = (HttpTestListener*)args;
  int fd_client = 0;
  socklen_t len_client = sizeof(sockaddr_in);  
  sockaddr_in addr_client = {};
  fd_client = accept(handler->fd_, (sockaddr*)&addr_client, &len_client);
  http_parser_init_(handler->parser_, HTTP_REQUEST);
  handler->parser_->data = client;
  for(;;) {
    int len = recv(fd_client, buf, sizeof(buf), 0);
    if(len <= 0) {
      break;
    }
    http_parser_execute_(client->parser_, &htp_hooks, buf, len);

    if(handler->parser_->http_errno != 0 || handler->is_request_complete_) {
      break;
    }
  }

  if(handler->is_request_complete_) {
    char write_buf[4096];
    snprintf(write_buf, sizeof(write_buf), "HTTP/1.1 %s\r\n", get_status_string(handler->response_status_code_, 0));
    write(fd_client, write_buf, strlen(write_buf));
    for(std::map<std::string, std::string>::iterator it = handler->map_response_header_.begin();
        it !=  handler->map_response_header_.end(); it++) {
      snprintf(write_buf, sizeof(write_buf), "%s: %s\r\n", it->first.c_str(), it->second.c_str());
      write(fd_client, write_buf, strlen(write_buf));
    }
    write(fd_client, "\r\n", 2);

    if(client->response_body_.size() > 0) {
      write(fd_client, client->response_body_.c_str(), client->response_body_.size());
    }

  }
out:
  close(handler->fd_);
  close(fd_client);
  return NULL;
}